

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O3

size_t __thiscall
xemmai::t_type_of<xemmai::t_list>::f_do_set_at
          (t_type_of<xemmai::t_list> *this,t_object *a_this,t_pvalue *a_stack)

{
  t_list *this_00;
  pthread_rwlock_t *__rwlock;
  ulong uVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  t_value<xemmai::t_slot> *ptVar5;
  wchar_t *extraout_RDX;
  size_t *psVar6;
  t_pvalue *extraout_RDX_00;
  ulong uVar7;
  long in_FS_OFFSET;
  wstring_view a_message;
  wstring_view a_message_00;
  size_t local_30;
  
  uVar1 = a_this->v_count;
  if ((uVar1 != 3) &&
     ((((uVar1 < 3 || (uVar1 == 4)) || (*(long *)(*(long *)(uVar1 + 0x40) + 8) == 0)) ||
      (a_stack = (t_pvalue *)&v__type_id<long>,
      *(undefined8 **)(*(long *)(*(long *)(uVar1 + 0x40) + 0x10) + 8) != &v__type_id<long>)))) {
    f_do_set_at();
    a_stack = extraout_RDX_00;
LAB_0015f1cb:
    a_message._M_str = (wchar_t *)a_stack;
    a_message._M_len = (size_t)L"owned by another thread.";
    f_throw((xemmai *)0x18,a_message);
  }
  this_00 = (t_list *)
            ((long)&(this->
                    super_t_derivable<xemmai::t_holds<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>,_xemmai::t_derived<xemmai::t_type_of<xemmai::t_list>_>_>
                    ).super_t_holds<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>.
                    super_t_finalizes<xemmai::t_bears<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>_>
                    .super_t_bears<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>.
                    super_t_derives<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>.
                    super_t_type_of<xemmai::t_sharable>.
                    super_t_bears<xemmai::t_sharable,_xemmai::t_type_of<xemmai::t_object>_> + 0x48);
  lVar2 = *(long *)((long)&(this->
                           super_t_derivable<xemmai::t_holds<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>,_xemmai::t_derived<xemmai::t_type_of<xemmai::t_list>_>_>
                           ).super_t_holds<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>.
                           super_t_finalizes<xemmai::t_bears<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>_>
                           .super_t_bears<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>.
                           super_t_derives<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>.
                           super_t_type_of<xemmai::t_sharable>.
                           super_t_bears<xemmai::t_sharable,_xemmai::t_type_of<xemmai::t_object>_> +
                   0x48);
  if (lVar2 == *(long *)(in_FS_OFFSET + -0x68)) {
    psVar6 = (size_t *)(uVar1 + 0x48);
    if (uVar1 < 5) {
      psVar6 = &a_this->v_cyclic;
    }
    local_30 = *psVar6;
    t_list::f_validate(this_00,(intptr_t *)&local_30);
    uVar4 = *(offset_in_t_type_to_subr *)
             ((long)&(this->
                     super_t_derivable<xemmai::t_holds<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>,_xemmai::t_derived<xemmai::t_type_of<xemmai::t_list>_>_>
                     ).super_t_holds<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>.
                     super_t_finalizes<xemmai::t_bears<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>_>
                     .super_t_bears<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>.
                     super_t_derives<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>.
                     super_t_type_of<xemmai::t_sharable>.
                     super_t_bears<xemmai::t_sharable,_xemmai::t_type_of<xemmai::t_object>_> + 0x90)
            + local_30;
    lVar2 = *(long *)((long)&(this->
                             super_t_derivable<xemmai::t_holds<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>,_xemmai::t_derived<xemmai::t_type_of<xemmai::t_list>_>_>
                             ).super_t_holds<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>
                             .
                             super_t_finalizes<xemmai::t_bears<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>_>
                             .super_t_bears<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>.
                             super_t_derives<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>
                             .super_t_type_of<xemmai::t_sharable>.
                             super_t_bears<xemmai::t_sharable,_xemmai::t_type_of<xemmai::t_object>_>
                     + 0x88);
    uVar1 = *(ulong *)(lVar2 + 0x48);
    uVar7 = 0;
    if (uVar1 <= uVar4) {
      uVar7 = uVar1;
    }
    ptVar5 = t_value<xemmai::t_slot>::operator=
                       ((t_value<xemmai::t_slot> *)(lVar2 + (uVar4 - uVar7) * 0x10 + 0x50),
                        (t_value<xemmai::t_pointer> *)&a_this->v_rank);
    a_this->v_next = (ptVar5->super_t_slot).v_p._M_b._M_p;
    a_this->v_previous = (t_object *)ptVar5->field_0;
  }
  else {
    if (lVar2 != 0) goto LAB_0015f1cb;
    __rwlock = (pthread_rwlock_t *)
               ((long)&(this->
                       super_t_derivable<xemmai::t_holds<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>,_xemmai::t_derived<xemmai::t_type_of<xemmai::t_list>_>_>
                       ).super_t_holds<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>.
                       super_t_finalizes<xemmai::t_bears<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>_>
                       .super_t_bears<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>.
                       super_t_derives<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>.
                       super_t_type_of<xemmai::t_sharable>.
                       super_t_bears<xemmai::t_sharable,_xemmai::t_type_of<xemmai::t_object>_> +
               0x50);
    iVar3 = pthread_rwlock_wrlock(__rwlock);
    if (iVar3 == 0x23) {
      std::__throw_system_error(0x23);
    }
    if ((this_00->super_t_sharable).super_t_owned.v_owner != (t_queue<128UL> *)0x0) {
      a_message_00._M_str = extraout_RDX;
      a_message_00._M_len = (size_t)L"owned by another thread.";
      f_throw((xemmai *)0x18,a_message_00);
    }
    psVar6 = (size_t *)(a_this->v_count + 0x48);
    if (a_this->v_count < 5) {
      psVar6 = &a_this->v_cyclic;
    }
    local_30 = *psVar6;
    t_list::f_validate(this_00,(intptr_t *)&local_30);
    uVar4 = *(offset_in_t_type_to_subr *)
             ((long)&(this->
                     super_t_derivable<xemmai::t_holds<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>,_xemmai::t_derived<xemmai::t_type_of<xemmai::t_list>_>_>
                     ).super_t_holds<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>.
                     super_t_finalizes<xemmai::t_bears<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>_>
                     .super_t_bears<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>.
                     super_t_derives<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>.
                     super_t_type_of<xemmai::t_sharable>.
                     super_t_bears<xemmai::t_sharable,_xemmai::t_type_of<xemmai::t_object>_> + 0x90)
            + local_30;
    lVar2 = *(long *)((long)&(this->
                             super_t_derivable<xemmai::t_holds<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>,_xemmai::t_derived<xemmai::t_type_of<xemmai::t_list>_>_>
                             ).super_t_holds<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>
                             .
                             super_t_finalizes<xemmai::t_bears<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>_>
                             .super_t_bears<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>.
                             super_t_derives<xemmai::t_list,_xemmai::t_type_of<xemmai::t_sharable>_>
                             .super_t_type_of<xemmai::t_sharable>.
                             super_t_bears<xemmai::t_sharable,_xemmai::t_type_of<xemmai::t_object>_>
                     + 0x88);
    uVar1 = *(ulong *)(lVar2 + 0x48);
    uVar7 = 0;
    if (uVar1 <= uVar4) {
      uVar7 = uVar1;
    }
    ptVar5 = t_value<xemmai::t_slot>::operator=
                       ((t_value<xemmai::t_slot> *)(lVar2 + (uVar4 - uVar7) * 0x10 + 0x50),
                        (t_value<xemmai::t_pointer> *)&a_this->v_rank);
    a_this->v_next = (ptVar5->super_t_slot).v_p._M_b._M_p;
    a_this->v_previous = (t_object *)ptVar5->field_0;
    pthread_rwlock_unlock(__rwlock);
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t t_type_of<t_list>::f_do_set_at(t_object* a_this, t_pvalue* a_stack)
{
	f_check<intptr_t>(a_stack[2], L"index");
	auto& list = a_this->f_as<t_list>();
	list.f_owned_or_shared<std::lock_guard>([&]
	{
		a_stack[0] = list[f_as<intptr_t>(a_stack[2])] = a_stack[3];
	});
	return -1;
}